

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3Fts3Incrmerge(Fts3Table *p,int nMerge,int nMin)

{
  int iVar1;
  int local_b4;
  int nKey;
  char *zKey;
  int bIgnore;
  int nHintSeg;
  sqlite3_int64 iHintAbsLevel;
  int local_80;
  int nHint;
  int iIdx;
  int bUseHint;
  sqlite3_stmt *pFindLevel;
  i64 nMod;
  int nAlloc;
  int bDirtyHint;
  Blob hint;
  sqlite3_int64 iAbsLevel;
  IncrmergeWriter *pIStack_40;
  int nSeg;
  IncrmergeWriter *pWriter;
  Fts3SegFilter *pFilter;
  Fts3MultiSegReader *pCsr;
  int nRem;
  int rc;
  int nMin_local;
  int nMerge_local;
  Fts3Table *p_local;
  
  iAbsLevel._4_4_ = 0;
  hint.n = 0;
  hint.nAlloc = 0;
  pCsr._0_4_ = nMerge;
  nRem = nMin;
  rc = nMerge;
  _nMin_local = p;
  memset(&nAlloc,0,0x10);
  nMod._4_4_ = 0;
  nMod._0_4_ = 0x328;
  pIStack_40 = (IncrmergeWriter *)sqlite3_malloc(0x328);
  if (pIStack_40 == (IncrmergeWriter *)0x0) {
    p_local._4_4_ = 7;
  }
  else {
    pWriter = pIStack_40 + 1;
    pFilter = (Fts3SegFilter *)&pIStack_40[1].iStart;
    pCsr._4_4_ = fts3IncrmergeHintLoad(_nMin_local,(Blob *)&nAlloc);
    while (pCsr._4_4_ == 0 && 0 < (int)pCsr) {
      pFindLevel = (sqlite3_stmt *)(long)(_nMin_local->nIndex << 10);
      _iIdx = (sqlite3_stmt *)0x0;
      nHint = 0;
      local_80 = 0;
      pCsr._4_4_ = fts3SqlStmt(_nMin_local,0x1c,(sqlite3_stmt **)&iIdx,(sqlite3_value **)0x0);
      if (nRem < 2) {
        local_b4 = 2;
      }
      else {
        local_b4 = nRem;
      }
      sqlite3_bind_int(_iIdx,1,local_b4);
      iVar1 = sqlite3_step(_iIdx);
      if (iVar1 == 100) {
        hint._8_8_ = sqlite3_column_int64(_iIdx,0);
        iAbsLevel._4_4_ = sqlite3_column_int(_iIdx,1);
      }
      else {
        iAbsLevel._4_4_ = -1;
      }
      pCsr._4_4_ = sqlite3_reset(_iIdx);
      if ((pCsr._4_4_ == 0) && ((int)hint.a != 0)) {
        iHintAbsLevel._4_4_ = (int)hint.a;
        _bIgnore = 0;
        zKey._4_4_ = 0;
        pCsr._4_4_ = fts3IncrmergeHintPop((Blob *)&nAlloc,(i64 *)&bIgnore,(int *)((long)&zKey + 4));
        if ((iAbsLevel._4_4_ < 0) ||
           (_bIgnore % (long)pFindLevel <= (long)hint._8_8_ % (long)pFindLevel)) {
          hint.n = bIgnore;
          hint.nAlloc = nHintSeg;
          iAbsLevel._4_4_ = zKey._4_4_;
          nHint = 1;
          nMod._4_4_ = 1;
        }
        else {
          hint.a._0_4_ = iHintAbsLevel._4_4_;
        }
      }
      if (iAbsLevel._4_4_ < 0) break;
      memset(pIStack_40,0,0x328);
      pWriter->iIdx = 1;
      if ((pCsr._4_4_ == 0) &&
         ((pCsr._4_4_ = fts3IncrmergeOutputIdx(_nMin_local,hint._8_8_,&local_80), local_80 == 0 ||
          ((nHint != 0 && (local_80 == 1)))))) {
        zKey._0_4_ = 0;
        pCsr._4_4_ = fts3SegmentIsMaxLevel(_nMin_local,hint._8_8_ + 1,(int *)&zKey);
        if ((int)zKey != 0) {
          pWriter->iIdx = pWriter->iIdx | 2;
        }
      }
      if (pCsr._4_4_ == 0) {
        pCsr._4_4_ = fts3IncrmergeCsr(_nMin_local,hint._8_8_,iAbsLevel._4_4_,
                                      (Fts3MultiSegReader *)pFilter);
      }
      if ((((pCsr._4_4_ == 0) && (pFilter->nTerm == iAbsLevel._4_4_)) &&
          (pCsr._4_4_ = sqlite3Fts3SegReaderStart
                                  (_nMin_local,(Fts3MultiSegReader *)pFilter,
                                   (Fts3SegFilter *)pWriter), pCsr._4_4_ == 0)) &&
         (pCsr._4_4_ = sqlite3Fts3SegReaderStep(_nMin_local,(Fts3MultiSegReader *)pFilter),
         pCsr._4_4_ == 100)) {
        if ((nHint == 0) || (local_80 < 1)) {
          pCsr._4_4_ = fts3IncrmergeWriter(_nMin_local,hint._8_8_,local_80,
                                           (Fts3MultiSegReader *)pFilter,pIStack_40);
        }
        else {
          pCsr._4_4_ = fts3IncrmergeLoad(_nMin_local,hint._8_8_,local_80 + -1,
                                         *(char **)&pFilter[2].nTerm,pFilter[2].flags,pIStack_40);
        }
        if ((pCsr._4_4_ == 0) && (pIStack_40->nLeafEst != 0)) {
          do {
            pCsr._4_4_ = fts3IncrmergeAppend(_nMin_local,pIStack_40,(Fts3MultiSegReader *)pFilter);
            if (pCsr._4_4_ == 0) {
              pCsr._4_4_ = sqlite3Fts3SegReaderStep(_nMin_local,(Fts3MultiSegReader *)pFilter);
            }
            if (((int)pCsr <= pIStack_40->nWork) && (pCsr._4_4_ == 100)) {
              pCsr._4_4_ = 0;
            }
          } while (pCsr._4_4_ == 100);
          if (pCsr._4_4_ == 0) {
            pCsr._0_4_ = (int)pCsr - (pIStack_40->nWork + 1);
            pCsr._4_4_ = fts3IncrmergeChomp(_nMin_local,hint._8_8_,(Fts3MultiSegReader *)pFilter,
                                            (int *)((long)&iAbsLevel + 4));
            if (iAbsLevel._4_4_ != 0) {
              nMod._4_4_ = 1;
              fts3IncrmergeHintPush
                        ((Blob *)&nAlloc,hint._8_8_,iAbsLevel._4_4_,(int *)((long)&pCsr + 4));
            }
          }
        }
        if (iAbsLevel._4_4_ != 0) {
          pIStack_40->nLeafData = -pIStack_40->nLeafData;
        }
        fts3IncrmergeRelease(_nMin_local,pIStack_40,(int *)((long)&pCsr + 4));
        if ((iAbsLevel._4_4_ == 0) && (pIStack_40->bNoLeafData == '\0')) {
          fts3PromoteSegments(_nMin_local,hint._8_8_ + 1,pIStack_40->nLeafData);
        }
      }
      sqlite3Fts3SegReaderFinish((Fts3MultiSegReader *)pFilter);
    }
    if ((nMod._4_4_ != 0) && (pCsr._4_4_ == 0)) {
      pCsr._4_4_ = fts3IncrmergeHintStore(_nMin_local,(Blob *)&nAlloc);
    }
    sqlite3_free(pIStack_40);
    sqlite3_free(_nAlloc);
    p_local._4_4_ = pCsr._4_4_;
  }
  return p_local._4_4_;
}

Assistant:

SQLITE_PRIVATE int sqlite3Fts3Incrmerge(Fts3Table *p, int nMerge, int nMin){
  int rc;                         /* Return code */
  int nRem = nMerge;              /* Number of leaf pages yet to  be written */
  Fts3MultiSegReader *pCsr;       /* Cursor used to read input data */
  Fts3SegFilter *pFilter;         /* Filter used with cursor pCsr */
  IncrmergeWriter *pWriter;       /* Writer object */
  int nSeg = 0;                   /* Number of input segments */
  sqlite3_int64 iAbsLevel = 0;    /* Absolute level number to work on */
  Blob hint = {0, 0, 0};          /* Hint read from %_stat table */
  int bDirtyHint = 0;             /* True if blob 'hint' has been modified */

  /* Allocate space for the cursor, filter and writer objects */
  const int nAlloc = sizeof(*pCsr) + sizeof(*pFilter) + sizeof(*pWriter);
  pWriter = (IncrmergeWriter *)sqlite3_malloc(nAlloc);
  if( !pWriter ) return SQLITE_NOMEM;
  pFilter = (Fts3SegFilter *)&pWriter[1];
  pCsr = (Fts3MultiSegReader *)&pFilter[1];

  rc = fts3IncrmergeHintLoad(p, &hint);
  while( rc==SQLITE_OK && nRem>0 ){
    const i64 nMod = FTS3_SEGDIR_MAXLEVEL * p->nIndex;
    sqlite3_stmt *pFindLevel = 0; /* SQL used to determine iAbsLevel */
    int bUseHint = 0;             /* True if attempting to append */
    int iIdx = 0;                 /* Largest idx in level (iAbsLevel+1) */

    /* Search the %_segdir table for the absolute level with the smallest
    ** relative level number that contains at least nMin segments, if any.
    ** If one is found, set iAbsLevel to the absolute level number and
    ** nSeg to nMin. If no level with at least nMin segments can be found, 
    ** set nSeg to -1.
    */
    rc = fts3SqlStmt(p, SQL_FIND_MERGE_LEVEL, &pFindLevel, 0);
    sqlite3_bind_int(pFindLevel, 1, MAX(2, nMin));
    if( sqlite3_step(pFindLevel)==SQLITE_ROW ){
      iAbsLevel = sqlite3_column_int64(pFindLevel, 0);
      nSeg = sqlite3_column_int(pFindLevel, 1);
      assert( nSeg>=2 );
    }else{
      nSeg = -1;
    }
    rc = sqlite3_reset(pFindLevel);

    /* If the hint read from the %_stat table is not empty, check if the
    ** last entry in it specifies a relative level smaller than or equal
    ** to the level identified by the block above (if any). If so, this 
    ** iteration of the loop will work on merging at the hinted level.
    */
    if( rc==SQLITE_OK && hint.n ){
      int nHint = hint.n;
      sqlite3_int64 iHintAbsLevel = 0;      /* Hint level */
      int nHintSeg = 0;                     /* Hint number of segments */

      rc = fts3IncrmergeHintPop(&hint, &iHintAbsLevel, &nHintSeg);
      if( nSeg<0 || (iAbsLevel % nMod) >= (iHintAbsLevel % nMod) ){
        iAbsLevel = iHintAbsLevel;
        nSeg = nHintSeg;
        bUseHint = 1;
        bDirtyHint = 1;
      }else{
        /* This undoes the effect of the HintPop() above - so that no entry
        ** is removed from the hint blob.  */
        hint.n = nHint;
      }
    }

    /* If nSeg is less that zero, then there is no level with at least
    ** nMin segments and no hint in the %_stat table. No work to do.
    ** Exit early in this case.  */
    if( nSeg<0 ) break;

    /* Open a cursor to iterate through the contents of the oldest nSeg 
    ** indexes of absolute level iAbsLevel. If this cursor is opened using 
    ** the 'hint' parameters, it is possible that there are less than nSeg
    ** segments available in level iAbsLevel. In this case, no work is
    ** done on iAbsLevel - fall through to the next iteration of the loop 
    ** to start work on some other level.  */
    memset(pWriter, 0, nAlloc);
    pFilter->flags = FTS3_SEGMENT_REQUIRE_POS;

    if( rc==SQLITE_OK ){
      rc = fts3IncrmergeOutputIdx(p, iAbsLevel, &iIdx);
      assert( bUseHint==1 || bUseHint==0 );
      if( iIdx==0 || (bUseHint && iIdx==1) ){
        int bIgnore = 0;
        rc = fts3SegmentIsMaxLevel(p, iAbsLevel+1, &bIgnore);
        if( bIgnore ){
          pFilter->flags |= FTS3_SEGMENT_IGNORE_EMPTY;
        }
      }
    }

    if( rc==SQLITE_OK ){
      rc = fts3IncrmergeCsr(p, iAbsLevel, nSeg, pCsr);
    }
    if( SQLITE_OK==rc && pCsr->nSegment==nSeg
     && SQLITE_OK==(rc = sqlite3Fts3SegReaderStart(p, pCsr, pFilter))
     && SQLITE_ROW==(rc = sqlite3Fts3SegReaderStep(p, pCsr))
    ){
      if( bUseHint && iIdx>0 ){
        const char *zKey = pCsr->zTerm;
        int nKey = pCsr->nTerm;
        rc = fts3IncrmergeLoad(p, iAbsLevel, iIdx-1, zKey, nKey, pWriter);
      }else{
        rc = fts3IncrmergeWriter(p, iAbsLevel, iIdx, pCsr, pWriter);
      }

      if( rc==SQLITE_OK && pWriter->nLeafEst ){
        fts3LogMerge(nSeg, iAbsLevel);
        do {
          rc = fts3IncrmergeAppend(p, pWriter, pCsr);
          if( rc==SQLITE_OK ) rc = sqlite3Fts3SegReaderStep(p, pCsr);
          if( pWriter->nWork>=nRem && rc==SQLITE_ROW ) rc = SQLITE_OK;
        }while( rc==SQLITE_ROW );

        /* Update or delete the input segments */
        if( rc==SQLITE_OK ){
          nRem -= (1 + pWriter->nWork);
          rc = fts3IncrmergeChomp(p, iAbsLevel, pCsr, &nSeg);
          if( nSeg!=0 ){
            bDirtyHint = 1;
            fts3IncrmergeHintPush(&hint, iAbsLevel, nSeg, &rc);
          }
        }
      }

      if( nSeg!=0 ){
        pWriter->nLeafData = pWriter->nLeafData * -1;
      }
      fts3IncrmergeRelease(p, pWriter, &rc);
      if( nSeg==0 && pWriter->bNoLeafData==0 ){
        fts3PromoteSegments(p, iAbsLevel+1, pWriter->nLeafData);
      }
    }

    sqlite3Fts3SegReaderFinish(pCsr);
  }

  /* Write the hint values into the %_stat table for the next incr-merger */
  if( bDirtyHint && rc==SQLITE_OK ){
    rc = fts3IncrmergeHintStore(p, &hint);
  }

  sqlite3_free(pWriter);
  sqlite3_free(hint.a);
  return rc;
}